

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O3

bool __thiscall
ON_RenderContentPrivate::ChangeChild
          (ON_RenderContentPrivate *this,ON_RenderContent *old_child,ON_RenderContent *new_child)

{
  ON_RenderContentPrivate **ppOVar1;
  ON_RenderContentPrivate *pOVar2;
  ON_RenderContentPrivate *pOVar3;
  ON_RenderContent *pOVar4;
  ON_RenderContent **ppOVar5;
  
  if (old_child == (ON_RenderContent *)0x0) {
    return false;
  }
  pOVar4 = this->m_first_child;
  if (pOVar4 == old_child) {
    ppOVar5 = &this->m_first_child;
  }
  else {
    do {
      if (pOVar4 == (ON_RenderContent *)0x0) {
        return false;
      }
      ppOVar1 = &pOVar4->_private;
      pOVar4 = (*ppOVar1)->m_next_sibling;
    } while (pOVar4 != old_child);
    ppOVar5 = &(*ppOVar1)->m_next_sibling;
  }
  if (new_child == (ON_RenderContent *)0x0) {
    *ppOVar5 = old_child->_private->m_next_sibling;
  }
  else {
    *ppOVar5 = new_child;
    pOVar2 = old_child->_private;
    pOVar3 = new_child->_private;
    pOVar3->m_next_sibling = pOVar2->m_next_sibling;
    pOVar3->m_parent = pOVar2->m_parent;
  }
  (*(old_child->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[4])(old_child);
  return true;
}

Assistant:

bool ON_RenderContentPrivate::ChangeChild(ON_RenderContent* old_child, ON_RenderContent* new_child)
{
  if (nullptr == old_child)
    return false;

  if (old_child == m_first_child)
  {
    if (nullptr != new_child)
    {
      m_first_child = new_child;
    }
    else
    {
      m_first_child = old_child->_private->m_next_sibling;
    }
  }
  else
  {
    const ON_RenderContent* prev_sibling = FindPrevSibling(old_child);
    if (nullptr == prev_sibling)
      return false;

    if (nullptr != new_child)
    {
      prev_sibling->_private->m_next_sibling = new_child;
    }
    else
    {
      prev_sibling->_private->m_next_sibling = old_child->_private->m_next_sibling;
    }
  }

  if (nullptr != new_child)
  {
    new_child->_private->m_next_sibling = old_child->_private->m_next_sibling;
    new_child->_private->m_parent = old_child->_private->m_parent;
  }

  delete old_child;

  return true;
}